

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmulqdq_tpl.h
# Opt level: O2

uint32_t crc32_vpclmulqdq(uint32_t crc32,uint8_t *buf,size_t len)

{
  uint uVar1;
  uint32_t uVar2;
  size_t sVar3;
  crc32_fold crc_state;
  undefined1 local_58 [16];
  uint8_t local_48 [64];
  
  if (len < 0x10) {
    uVar1 = ~crc32;
    for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
      uVar1 = uVar1 >> 8 ^ crc_table[(byte)(buf[sVar3] ^ (byte)uVar1)];
    }
    return ~uVar1;
  }
  local_58 = SUB6416(ZEXT464(0x9db42487),0);
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48[0x1c] = '\0';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\0';
  local_48[0x20] = '\0';
  local_48[0x21] = '\0';
  local_48[0x22] = '\0';
  local_48[0x23] = '\0';
  local_48[0x24] = '\0';
  local_48[0x25] = '\0';
  local_48[0x26] = '\0';
  local_48[0x27] = '\0';
  local_48[0x28] = '\0';
  local_48[0x29] = '\0';
  local_48[0x2a] = '\0';
  local_48[0x2b] = '\0';
  local_48[0x2c] = '\0';
  local_48[0x2d] = '\0';
  local_48[0x2e] = '\0';
  local_48[0x2f] = '\0';
  crc32_fold_vpclmulqdq((crc32_fold *)local_58,buf,len,crc32);
  uVar2 = crc32_fold_vpclmulqdq_final((crc32_fold *)local_58);
  return uVar2;
}

Assistant:

Z_INTERNAL uint32_t CRC32(uint32_t crc32, const uint8_t *buf, size_t len) {
    /* For lens smaller than ~12, crc32_small method is faster.
     * But there are also minimum requirements for the pclmul functions due to alignment */
    if (len < 16)
        return crc32_small(crc32, buf, len);

    crc32_fold ALIGNED_(16) crc_state;
    CRC32_FOLD_RESET(&crc_state);
    CRC32_FOLD(&crc_state, buf, len, crc32);
    return CRC32_FOLD_FINAL(&crc_state);
}